

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

SSTableData * __thiscall SSTable::getAllData(SSTable *this)

{
  bool bVar1;
  SSTableHeader *pSVar2;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *this_00;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [8];
  SSTableDataEntry temp;
  fpos<__mbstate_t> local_230;
  undefined1 local_220 [8];
  ifstream in;
  SSTableHeader *h;
  SSTable *this_local;
  
  if ((this->data == (SSTableData *)0x0) ||
     (bVar1 = std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::empty(this->data),
     bVar1)) {
    pSVar2 = getHeader(this);
    create_binary_ifstream((path *)local_220);
    std::fpos<__mbstate_t>::fpos(&local_230,0x20);
    std::istream::seekg(local_220,local_230._M_off,local_230._M_state);
    this_00 = (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)operator_new(0x18);
    memset(this_00,0,0x18);
    std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector(this_00);
    this->data = this_00;
    memset(local_280,0,0x40);
    SSTableDataEntry::SSTableDataEntry((SSTableDataEntry *)local_280);
    while( true ) {
      auVar4 = std::istream::tellg();
      local_290 = auVar4;
      uVar3 = std::fpos::operator_cast_to_long((fpos *)local_290);
      if (pSVar2->index_offset <= uVar3) break;
      operator>>((istream *)local_220,(SSTableDataEntry *)local_280);
      std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::push_back
                (this->data,(value_type *)local_280);
    }
    SSTableDataEntry::~SSTableDataEntry((SSTableDataEntry *)local_280);
    std::ifstream::~ifstream(local_220);
  }
  return this->data;
}

Assistant:

SSTableData *SSTable::getAllData() {
    if (data == nullptr || data->empty()) {
        auto *h = getHeader();
        auto in = create_binary_ifstream(file);
        in.seekg(32); // Header always consume 32 bytes.
        data = new SSTableData{};
        auto temp = SSTableDataEntry{};
        while (in.tellg() < h->index_offset) {
            in >> temp;
            data->push_back(std::move(temp));
        }
    }
    return data;
}